

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

void __thiscall
CVmObjHTTPRequest::load_from_image(CVmObjHTTPRequest *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  undefined4 in_register_00000034;
  
  load_image_data(this,(char *)CONCAT44(in_register_00000034,self),(size_t)ptr);
  CVmObjTable::save_image_pointer(&G_obj_table_X,self,ptr,siz);
  return;
}

Assistant:

void CVmObjHTTPRequest::load_from_image(VMG_ vm_obj_id_t self,
                                        const char *ptr, size_t siz)
{
    /* load our image data */
    load_image_data(vmg_ ptr, siz);

    /* 
     *   save our image data pointer in the object table, so that we can
     *   access it (without storing it ourselves) during a reload 
     */
    G_obj_table->save_image_pointer(self, ptr, siz);
}